

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

CreateMode __thiscall create::Create::getMode(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_40 [32];
  Create *local_10;
  Create *this_local;
  
  local_10 = this;
  peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->data);
  bVar1 = Data::isValidPacketID(peVar3,'#');
  if (bVar1) {
    if ((this->modeReportWorkaround & 1U) == 0) {
      peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->data);
      Data::getPacket((Data *)local_40,(uint8_t)peVar3);
      peVar4 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
      uVar2 = Packet::getData(peVar4);
      this->mode = (uint)uVar2;
      std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_40);
    }
    else {
      peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->data);
      Data::getPacket((Data *)&stack0xffffffffffffffe0,(uint8_t)peVar3);
      peVar4 = std::__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
      uVar2 = Packet::getData(peVar4);
      this->mode = (uint)uVar2 + MODE_UNAVAILABLE;
      std::shared_ptr<create::Packet>::~shared_ptr
                ((shared_ptr<create::Packet> *)&stack0xffffffffffffffe0);
    }
  }
  return this->mode;
}

Assistant:

create::CreateMode Create::getMode() {
    if (data->isValidPacketID(ID_OI_MODE)) {
      if (modeReportWorkaround) {
        mode = (create::CreateMode) (GET_DATA(ID_OI_MODE) - 1);
      } else {
        mode = (create::CreateMode) GET_DATA(ID_OI_MODE);
      }
    }

    return mode;
  }